

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeObjectSystem.cpp
# Opt level: O0

void __thiscall
RuntimeObjectSystem::SetupObjectConstructors
          (RuntimeObjectSystem *this,IPerModuleInterface *pPerModuleInterface)

{
  value_type pIVar1;
  int iVar2;
  undefined4 extraout_var;
  size_type sVar3;
  const_reference ppIVar4;
  IObjectConstructor **ppIVar5;
  size_t iMax;
  size_t i;
  AUDynArray<IObjectConstructor_*> constructors;
  vector<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_> *objectConstructors;
  IPerModuleInterface *pPerModuleInterface_local;
  RuntimeObjectSystem *this_local;
  
  (*pPerModuleInterface->_vptr_IPerModuleInterface[2])(pPerModuleInterface,this->m_pSystemTable);
  (*pPerModuleInterface->_vptr_IPerModuleInterface[3])(pPerModuleInterface,this);
  iVar2 = (**pPerModuleInterface->_vptr_IPerModuleInterface)();
  constructors.super_IAUDynArray<IObjectConstructor_*>.m_vec.
  super__Vector_base<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var,iVar2);
  sVar3 = std::vector<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>::size
                    ((vector<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_> *)
                     constructors.super_IAUDynArray<IObjectConstructor_*>.m_vec.
                     super__Vector_base<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  AUDynArray<IObjectConstructor_*>::AUDynArray((AUDynArray<IObjectConstructor_*> *)&i,sVar3);
  iMax = 0;
  sVar3 = std::vector<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>::size
                    ((vector<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_> *)
                     constructors.super_IAUDynArray<IObjectConstructor_*>.m_vec.
                     super__Vector_base<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  for (; iMax < sVar3; iMax = iMax + 1) {
    ppIVar4 = std::vector<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>::operator[]
                        ((vector<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_> *)
                         constructors.super_IAUDynArray<IObjectConstructor_*>.m_vec.
                         super__Vector_base<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,iMax);
    pIVar1 = *ppIVar4;
    ppIVar5 = IAUDynArray<IObjectConstructor_*>::operator[]
                        ((IAUDynArray<IObjectConstructor_*> *)&i,iMax);
    *ppIVar5 = pIVar1;
  }
  if ((this->m_bAutoCompile & 1U) != 0) {
    SetupRuntimeFileTracking(this,(IAUDynArray<IObjectConstructor_*> *)&i);
  }
  (*this->m_pObjectFactorySystem->_vptr_IObjectFactorySystem[3])(this->m_pObjectFactorySystem,&i);
  AUDynArray<IObjectConstructor_*>::~AUDynArray((AUDynArray<IObjectConstructor_*> *)&i);
  return;
}

Assistant:

void RuntimeObjectSystem::SetupObjectConstructors(IPerModuleInterface* pPerModuleInterface)
{
    // Set system Table
    pPerModuleInterface->SetSystemTable( m_pSystemTable );
    pPerModuleInterface->SetRuntimeObjectSystem( this );

	// get hold of the constructors
	const std::vector<IObjectConstructor*> &objectConstructors = pPerModuleInterface->GetConstructors();
	AUDynArray<IObjectConstructor*> constructors(objectConstructors.size());
	for (size_t i = 0, iMax = objectConstructors.size(); i < iMax; ++i)
	{
		constructors[i] = objectConstructors[i];
	}

	if (m_bAutoCompile)
	{
		SetupRuntimeFileTracking(constructors);
	}

	m_pObjectFactorySystem->AddConstructors(constructors);

}